

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::NodeHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::NodeHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
::_find_key<std::unique_ptr<int,std::default_delete<int>>>
          (raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::NodeHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::NodeHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
           *this,unique_ptr<int,_std::default_delete<int>_> *key,size_t hashval)

{
  long lVar1;
  h2_t hash;
  bool bVar2;
  size_t sVar3;
  unique_ptr<int,_std::default_delete<int>_> *ts;
  uint local_84;
  EqualElement<std::unique_ptr<int,_std::default_delete<int>_>_> local_80;
  uint local_70;
  BitMask<unsigned_int,_16,_0> local_6c;
  uint32_t i;
  BitMask<unsigned_int,_16,_0> __end4;
  BitMask<unsigned_int,_16,_0> __begin4;
  BitMask<unsigned_int,_16,_0> *__range4;
  Group g;
  undefined1 local_40 [8];
  probe_seq<16UL> seq;
  size_t hashval_local;
  unique_ptr<int,_std::default_delete<int>_> *key_local;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  *this_local;
  
  seq.index_ = hashval;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  ::probe((probe_seq<16UL> *)local_40,
          (raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           *)this,hashval);
  do {
    lVar1 = *(long *)this;
    sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40);
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)&__range4,(ctrl_t *)(lVar1 + sVar3));
    hash = H2(seq.index_);
    __end4 = GroupSse2Impl::Match((GroupSse2Impl *)&__range4,hash);
    i = (uint32_t)BitMask<unsigned_int,_16,_0>::begin(&__end4);
    local_6c = BitMask<unsigned_int,_16,_0>::end(&__end4);
    while (bVar2 = priv::operator!=((BitMask<unsigned_int,_16,_0> *)&i,&local_6c), bVar2) {
      local_70 = BitMask<unsigned_int,_16,_0>::operator*((BitMask<unsigned_int,_16,_0> *)&i);
      local_80.rhs = key;
      local_80.eq = raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                    ::eq_ref((raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                              *)this);
      lVar1 = *(long *)(this + 8);
      sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40,(ulong)local_70);
      ts = hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,void>
           ::element<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>>
                     ((slot_type *)(lVar1 + sVar3 * 8));
      bVar2 = hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,void>
              ::
              apply<phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::NodeHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::NodeHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>::EqualElement<std::unique_ptr<int,std::default_delete<int>>>,std::unique_ptr<int,std::default_delete<int>>&,phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>>
                        (&local_80,ts);
      if (bVar2) {
        sVar3 = probe_seq<16UL>::offset((probe_seq<16UL> *)local_40,(ulong)local_70);
        return sVar3;
      }
      BitMask<unsigned_int,_16,_0>::operator++((BitMask<unsigned_int,_16,_0> *)&i);
    }
    local_84 = (uint)GroupSse2Impl::MatchEmpty((GroupSse2Impl *)&__range4);
    bVar2 = BitMask::operator_cast_to_bool((BitMask *)&local_84);
    if (bVar2) {
      return 0xffffffffffffffff;
    }
    probe_seq<16UL>::next((probe_seq<16UL> *)local_40);
  } while( true );
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }